

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint64_t helper_neon_qshl_u64_arm(CPUARMState *env,uint64_t val,uint64_t shiftop)

{
  ulong uVar1;
  byte bVar2;
  
  bVar2 = (byte)shiftop;
  if ((char)bVar2 < '@') {
    if ((char)bVar2 < -0x3f) {
      return 0;
    }
    if ((char)bVar2 < '\0') {
      return val >> (-bVar2 & 0x3f);
    }
    uVar1 = val << (bVar2 & 0x3f);
    if (uVar1 >> (bVar2 & 0x3f) == val) {
      return uVar1;
    }
  }
  else if (val == 0) {
    return 0;
  }
  (env->vfp).qc[0] = 1;
  return 0xffffffffffffffff;
}

Assistant:

uint64_t HELPER(neon_qshl_u64)(CPUARMState *env, uint64_t val, uint64_t shiftop)
{
    int8_t shift = (int8_t)shiftop;
    if (shift >= 64) {
        if (val) {
            val = ~(uint64_t)0;
            SET_QC();
        }
    } else if (shift <= -64) {
        val = 0;
    } else if (shift < 0) {
        val >>= -shift;
    } else {
        uint64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = ~(uint64_t)0;
        }
    }
    return val;
}